

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functional.cpp
# Opt level: O0

void __thiscall Functional::turn(Functional *this,int id,double alpha)

{
  pointer *this_00;
  double dVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  double dVar6;
  double dVar7;
  Group local_a8;
  Point local_80;
  int local_64;
  double dStack_60;
  int i;
  double tmpy;
  double tmpx;
  Group k;
  Group g;
  double alpha_local;
  int id_local;
  Functional *this_local;
  
  pvVar3 = std::vector<Group,_std::allocator<Group>_>::operator[]
                     ((vector<Group,_std::allocator<Group>_> *)this,(long)id);
  Group::Group((Group *)&k.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,pvVar3);
  Group::Group((Group *)&tmpx);
  local_64 = 0;
  while( true ) {
    iVar2 = local_64;
    sVar4 = std::vector<Point,_std::allocator<Point>_>::size
                      ((vector<Point,_std::allocator<Point>_> *)
                       &k.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if ((int)sVar4 <= iVar2) break;
    this_00 = &k.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pvVar5 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)this_00,(long)local_64);
    dVar1 = pvVar5->x;
    dVar6 = cos((alpha * 3.14159265) / 180.0);
    dVar7 = sin((alpha * 3.14159265) / 180.0);
    pvVar5 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)this_00,(long)local_64);
    tmpy = dVar1 * dVar6 - dVar7 * pvVar5->y;
    pvVar5 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)this_00,(long)local_64);
    dVar1 = pvVar5->x;
    dVar6 = sin((alpha * 3.14159265) / 180.0);
    dVar7 = cos((alpha * 3.14159265) / 180.0);
    pvVar5 = std::vector<Point,_std::allocator<Point>_>::operator[]
                       ((vector<Point,_std::allocator<Point>_> *)this_00,(long)local_64);
    dStack_60 = dVar1 * dVar6 + dVar7 * pvVar5->y;
    Point::Point(&local_80,tmpy,dStack_60);
    std::vector<Point,_std::allocator<Point>_>::push_back
              ((vector<Point,_std::allocator<Point>_> *)&tmpx,&local_80);
    local_64 = local_64 + 1;
  }
  Group::Group(&local_a8,(Group *)&tmpx);
  Field::add(&this->f,&local_a8);
  Group::~Group(&local_a8);
  Group::~Group((Group *)&tmpx);
  Group::~Group((Group *)&k.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Functional::turn(int id, double alpha) {
    Group g = f.groups[id];
    Group k;
    double tmpx, tmpy;
    for (int i = 0; i < (int) g.points.size(); i++) {
        tmpx = g.points[i].x * cos(PI * alpha / 180) - sin(PI * alpha / 180) * g.points[i].y;
        tmpy = g.points[i].x * sin(PI * alpha / 180) + cos(PI * alpha / 180) * g.points[i].y;
        k.points.push_back(Point(tmpx, tmpy));

    }
    f.add(k);

}